

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O0

vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *
vk::getPhysicalDeviceQueueFamilyProperties
          (vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
           *__return_storage_ptr__,InstanceInterface *vk,VkPhysicalDevice physicalDevice)

{
  VkPhysicalDevice pVVar1;
  VkPhysicalDevice pVVar2;
  reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  TestError *this;
  uint local_24;
  VkPhysicalDevice pVStack_20;
  deUint32 numQueues;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *vk_local;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *properties;
  
  local_24 = 0;
  pVStack_20 = physicalDevice;
  physicalDevice_local = (VkPhysicalDevice)vk;
  vk_local = (InstanceInterface *)__return_storage_ptr__;
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::vector
            (__return_storage_ptr__);
  (**(code **)(*(long *)physicalDevice_local + 0x30))(physicalDevice_local,pVStack_20,&local_24,0);
  if (local_24 != 0) {
    std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::resize
              (__return_storage_ptr__,(ulong)local_24);
    pVVar2 = physicalDevice_local;
    pVVar1 = pVStack_20;
    pvVar3 = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ::operator[](__return_storage_ptr__,0);
    (**(code **)(*(long *)pVVar2 + 0x30))(pVVar2,pVVar1,&local_24,pvVar3);
    uVar4 = (ulong)local_24;
    sVar5 = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
            size(__return_storage_ptr__);
    if (uVar4 != sVar5) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Returned queue family count changes between queries",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,0x40);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkQueueFamilyProperties> getPhysicalDeviceQueueFamilyProperties (const InstanceInterface& vk, VkPhysicalDevice physicalDevice)
{
	deUint32						numQueues	= 0;
	vector<VkQueueFamilyProperties>	properties;

	vk.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &numQueues, DE_NULL);

	if (numQueues > 0)
	{
		properties.resize(numQueues);
		vk.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &numQueues, &properties[0]);

		if ((size_t)numQueues != properties.size())
			TCU_FAIL("Returned queue family count changes between queries");
	}

	return properties;
}